

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O1

color_quad_u8 __thiscall
crnlib::etc1_block::unpack_color5(etc1_block *this,uint16 packed_color5,bool scaled,uint alpha)

{
  uint uVar1;
  undefined7 in_register_00000011;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar3 = packed_color5 & 0x1f;
  uVar4 = packed_color5 >> 5 & 0x1f;
  uVar2 = packed_color5 >> 10 & 0x1f;
  if ((int)CONCAT71(in_register_00000011,scaled) != 0) {
    uVar3 = (uVar3 >> 2) + uVar3 * 8;
    uVar4 = (uVar4 >> 2) + uVar4 * 8;
    uVar2 = (uVar2 >> 2) + uVar2 * 8;
  }
  uVar1 = 0xff;
  if (alpha < 0xff) {
    uVar1 = alpha;
  }
  (this->field_0).m_bytes[0] = (uint8)uVar2;
  (this->field_0).m_bytes[1] = (uint8)uVar4;
  (this->field_0).m_bytes[2] = (uint8)uVar3;
  (this->field_0).m_bytes[3] = (uint8)uVar1;
  return (color_quad_u8)SUB84(this,0);
}

Assistant:

color_quad_u8 etc1_block::unpack_color5(uint16 packed_color5, bool scaled, uint alpha)
    {
        uint b = packed_color5 & 31U;
        uint g = (packed_color5 >> 5U) & 31U;
        uint r = (packed_color5 >> 10U) & 31U;

        if (scaled)
        {
            b = (b << 3U) | (b >> 2U);
            g = (g << 3U) | (g >> 2U);
            r = (r << 3U) | (r >> 2U);
        }

        return color_quad_u8(cNoClamp, r, g, b, math::minimum(alpha, 255U));
    }